

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

PtexSeparableKernel * __thiscall
Ptex::v2_2::PtexSeparableKernel::operator=(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *__src;
  float *__src_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  __src = k->ku;
  __src_00 = k->kv;
  iVar1 = k->rot;
  iVar4 = k->u;
  iVar5 = k->v;
  iVar6 = k->uw;
  iVar7 = k->vw;
  iVar2 = k->uw;
  iVar3 = k->vw;
  this->res = k->res;
  this->u = iVar4;
  this->v = iVar5;
  this->uw = iVar6;
  this->vw = iVar7;
  memcpy(this->kubuff,__src,(long)iVar2 << 2);
  memcpy(this->kvbuff,__src_00,(long)iVar3 << 2);
  this->ku = this->kubuff;
  this->kv = this->kvbuff;
  this->rot = iVar1;
  return this;
}

Assistant:

PtexSeparableKernel& operator= (const PtexSeparableKernel& k)
    {
        set(k.res, k.u, k.v, k.uw, k.vw, k.ku, k.kv, k.rot);
        return *this;
    }